

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FormatTypeEDSK.cpp
# Opt level: O3

int __thiscall
FormatTypeEDSK::SaveDisk
          (FormatTypeEDSK *this,char *file_path,IDisk *disk,ILoadingProgress *loading_progress)

{
  void *pvVar1;
  uchar uVar2;
  unsigned_short uVar3;
  int iVar4;
  ulong *puVar5;
  long lVar6;
  undefined8 *__ptr;
  ulong uVar7;
  byte bVar8;
  byte bVar9;
  size_t __n;
  ulong uVar10;
  ulong uVar11;
  uint uVar12;
  int side;
  size_t sVar13;
  uint uVar14;
  long lVar15;
  ulong uVar16;
  uint uVar17;
  FILE *file;
  FILE *local_188;
  int local_17c;
  ulong *local_178;
  ulong *local_170;
  ulong local_168;
  ulong *local_160;
  ulong local_158;
  undefined8 *local_150;
  long local_148;
  size_t local_140;
  byte local_138 [32];
  undefined2 local_118;
  undefined8 local_116;
  undefined2 local_10e;
  undefined1 local_10c [4];
  undefined1 local_108;
  byte local_107;
  
  iVar4 = IDisk::SmartOpen(disk,(FILE **)&local_188,file_path,".DSK");
  if (iVar4 == 0) {
    local_138[0x10] = ' ';
    local_138[0x11] = 'F';
    local_138[0x12] = 'i';
    local_138[0x13] = 'l';
    local_138[0x14] = 'e';
    local_138[0x15] = '\r';
    local_138[0x16] = '\n';
    local_138[0x17] = 'D';
    local_138[0x18] = 'i';
    local_138[0x19] = 's';
    local_138[0x1a] = 'k';
    local_138[0x1b] = '-';
    local_138[0x1c] = 'I';
    local_138[0x1d] = 'n';
    local_138[0x1e] = 'f';
    local_138[0x1f] = 'o';
    local_138[0] = 'E';
    local_138[1] = 'X';
    local_138[2] = 'T';
    local_138[3] = 'E';
    local_138[4] = 'N';
    local_138[5] = 'D';
    local_138[6] = 'E';
    local_138[7] = 'D';
    local_138[8] = ' ';
    local_138[9] = 'C';
    local_138[10] = 'P';
    local_138[0xb] = 'C';
    local_138[0xc] = ' ';
    local_138[0xd] = 'D';
    local_138[0xe] = 'S';
    local_138[0xf] = 'K';
    local_118 = 0xa0d;
    memset(local_10c,0,0xd4);
    local_116 = 0x786f427261677553;
    local_10e = 0xa0d;
    uVar14 = disk->side_[0].nb_tracks;
    local_108 = (undefined1)uVar14;
    local_107 = disk->nb_sides_;
    uVar12 = (uint)local_107;
    uVar17 = local_107 * uVar14;
    lVar15 = (ulong)uVar17 * 0x20;
    puVar5 = (ulong *)operator_new__(lVar15 + 8);
    *puVar5 = (ulong)uVar17;
    local_170 = puVar5 + 1;
    if (uVar17 != 0) {
      lVar6 = 0;
      do {
        *(undefined8 *)((long)local_170 + lVar6) = 0;
        ((undefined8 *)((long)local_170 + lVar6))[1] = 0;
        *(undefined8 *)((long)puVar5 + lVar6 + 0x18) = 0;
        lVar6 = lVar6 + 0x20;
      } while (lVar15 != lVar6);
    }
    local_178 = puVar5;
    if (uVar14 != 0) {
      uVar17 = 0;
      iVar4 = 0x34;
      do {
        if ((char)uVar12 == '\0') {
          uVar12 = 0;
        }
        else {
          lVar15 = 0;
          do {
            side = (int)lVar15;
            uVar3 = IDisk::GetTrackInfo(disk,side,uVar17,
                                        (Track *)(local_170 + (ulong)(uVar12 * uVar17 + side) * 4));
            uVar12 = (uint)disk->nb_sides_;
            if ((uVar3 == 0) || ((int)puVar5[(ulong)(uVar17 * uVar12 + side) * 4 + 4] == 0)) {
              bVar8 = 0;
            }
            else {
              uVar14 = uVar3 + 0x100;
              if ((char)uVar3 == '\0') {
                uVar14 = (uint)uVar3;
              }
              bVar8 = (byte)(uVar14 >> 8);
            }
            local_138[lVar15 + iVar4] = bVar8;
            lVar15 = lVar15 + 1;
          } while ((uint)lVar15 < uVar12);
          iVar4 = iVar4 + (uint)lVar15;
          uVar14 = disk->side_[0].nb_tracks;
        }
        uVar17 = uVar17 + 1;
      } while (uVar17 < uVar14);
    }
    fwrite(local_138,0x100,1,local_188);
    uVar14 = disk->side_[0].nb_tracks;
    if (uVar14 != 0) {
      bVar8 = disk->nb_sides_;
      uVar12 = 0;
      puVar5 = local_170;
      bVar9 = bVar8;
      do {
        if (bVar9 == 0) {
          bVar9 = 0;
        }
        else {
          uVar14 = (uint)bVar9;
          uVar7 = 0;
          bVar9 = bVar8;
          do {
            uVar11 = (ulong)(uVar14 * uVar12 + (int)uVar7);
            uVar10 = puVar5[uVar11 * 4];
            uVar16 = puVar5[uVar11 * 4 + 1];
            if (uVar16 != uVar10) {
              local_160 = puVar5 + uVar11 * 4;
              bVar8 = local_138[(int)uVar7 + uVar14 * uVar12 + 0x34];
              uVar11 = (ulong)bVar8 * 0x100;
              __ptr = (undefined8 *)operator_new__(uVar11);
              sVar13 = 0;
              __n = uVar11 - 0xc;
              if (bVar8 == 0) {
                __n = sVar13;
              }
              local_158 = uVar11;
              memset((void *)((long)__ptr + 0xc),0,__n);
              *__ptr = 0x6e492d6b63617254;
              *(undefined4 *)(__ptr + 1) = 0xa0d6f66;
              *(char *)(__ptr + 2) = (char)uVar12;
              *(char *)((long)__ptr + 0x11) = (char)uVar7;
              *(undefined1 *)((long)__ptr + 0x14) = *(undefined1 *)(uVar10 + 0xb);
              *(char *)((long)__ptr + 0x15) = (char)((uint)((int)uVar16 - (int)uVar10) >> 2) * '9';
              *(undefined1 *)((long)__ptr + 0x16) = *(undefined1 *)((long)local_160 + 0x1c);
              *(undefined1 *)((long)__ptr + 0x17) = 0xe5;
              iVar4 = 0x100;
              lVar15 = 0x18;
              local_168 = uVar7;
              local_150 = __ptr;
              do {
                uVar7 = local_168;
                *(undefined1 *)((long)__ptr + lVar15) = *(undefined1 *)(uVar10 + 8 + sVar13 * 0x24);
                *(undefined1 *)((long)__ptr + lVar15 + 1) =
                     *(undefined1 *)(uVar10 + 9 + sVar13 * 0x24);
                *(undefined1 *)((long)__ptr + lVar15 + 2) =
                     *(undefined1 *)(uVar10 + 10 + sVar13 * 0x24);
                *(undefined1 *)((long)__ptr + lVar15 + 3) =
                     *(undefined1 *)(uVar10 + 0xb + sVar13 * 0x24);
                *(undefined1 *)((long)__ptr + lVar15 + 4) =
                     *(undefined1 *)(uVar10 + 0xd + sVar13 * 0x24);
                *(undefined1 *)((long)__ptr + lVar15 + 5) =
                     *(undefined1 *)(uVar10 + 0xe + sVar13 * 0x24);
                *(undefined1 *)((long)__ptr + lVar15 + 6) =
                     *(undefined1 *)(uVar10 + 0x10 + sVar13 * 0x24);
                *(undefined1 *)((long)__ptr + lVar15 + 7) =
                     *(undefined1 *)(uVar10 + 0x11 + sVar13 * 0x24);
                if (*(short *)(uVar10 + 0x10 + sVar13 * 0x24) != 0) {
                  uVar14 = *(int *)(uVar10 + sVar13 * 0x24 + 0x14) + 0x40;
                  lVar6 = 0;
                  local_17c = iVar4;
                  local_148 = lVar15;
                  local_140 = sVar13;
                  do {
                    uVar2 = IDisk::GetNextByte(disk,(int)uVar7,uVar12,uVar14);
                    *(uchar *)((long)__ptr + lVar6 + iVar4) = uVar2;
                    uVar14 = uVar14 + 0x10;
                    uVar10 = *local_160;
                    lVar6 = lVar6 + 1;
                  } while ((uint)lVar6 < (uint)*(ushort *)(uVar10 + 0x10 + sVar13 * 0x24));
                  iVar4 = local_17c + (uint)lVar6;
                  uVar16 = local_160[1];
                  lVar15 = local_148;
                  sVar13 = local_140;
                  __ptr = local_150;
                }
                lVar15 = lVar15 + 8;
                sVar13 = (size_t)((int)sVar13 + 1);
                uVar7 = ((long)(uVar16 - uVar10) >> 2) * -0x71c71c71c71c71c7;
              } while (sVar13 <= uVar7 && uVar7 - sVar13 != 0);
              fwrite(__ptr,local_158,1,local_188);
              operator_delete__(__ptr);
              bVar9 = disk->nb_sides_;
              uVar7 = local_168;
              puVar5 = local_170;
            }
            uVar17 = (int)uVar7 + 1;
            uVar7 = (ulong)uVar17;
            uVar14 = (uint)bVar9;
          } while (uVar17 < uVar14);
          uVar14 = disk->side_[0].nb_tracks;
          bVar8 = bVar9;
        }
        uVar12 = uVar12 + 1;
      } while (uVar12 < uVar14);
    }
    fclose(local_188);
    uVar10 = *local_178 * 0x20;
    uVar7 = uVar10 + 8;
    puVar5 = local_178;
    uVar16 = *local_178;
    while (uVar16 != 0) {
      pvVar1 = *(void **)((long)puVar5 + (uVar10 - 0x18));
      if (pvVar1 != (void *)0x0) {
        operator_delete(pvVar1,*(long *)((long)puVar5 + (uVar10 - 8)) - (long)pvVar1);
        puVar5 = local_178;
      }
      uVar10 = uVar10 - 0x20;
      uVar16 = uVar10;
    }
    operator_delete__(puVar5,uVar7);
    disk->disk_modified_ = false;
  }
  return 0;
}

Assistant:

int FormatTypeEDSK::SaveDisk(const char* file_path, IDisk* disk, ILoadingProgress* loading_progress) const
{
   FILE* file;
   int res = disk->SmartOpen(&file, file_path, ".DSK");

   if (res == 0)
   {
      // DISK INFORMATION BLOCK
      unsigned int nb_sectors = 0;
      unsigned char dib[0x100] = {0};
      memcpy(dib, "EXTENDED CPC DSK File\r\nDisk-Info\r\n", 34);
      memcpy(&dib[0x22], "SugarBox\r\n", 10);

      dib[0x30] = disk->side_[0].nb_tracks;
      dib[0x31] = disk->nb_sides_;
      //memcpy ( &dib[0x30], &m_Disk[0].NbTracks , 1 );
      //memcpy ( &dib[0x31], &m_NbSide , 1 );

      // Track size table
      // For each track :
      IDisk::Track* track = new IDisk::Track[disk->side_[0].nb_tracks * disk->nb_sides_];

      int offset = 0x34;
      for (unsigned int j = 0; j < disk->side_[0].nb_tracks; j++)
      {
         for (int i = 0; i < disk->nb_sides_; i++)
         {
            // Get size
            unsigned short size = disk->GetTrackInfo(i, j, &track[j * disk->nb_sides_ + i]);

            if (size != 0)
            {
               if (track[j * disk->nb_sides_ + i].full_size_ == 0)
               {
                  size = 0;
               }
               else if ((size & 0xFFFFFF00) < size)
               {
                  size += 0x100;
               }
            }
            dib[offset++] = (unsigned char)(size >> 8);
         }
      }
      fwrite(dib, 0x100, 1, file);

      // For each track :
      for (unsigned int j = 0; j < disk->side_[0].nb_tracks; j++)
      {
         for (int i = 0; i < disk->nb_sides_; i++)
         {
            IDisk::Track* info_track = &track[j * disk->nb_sides_ + i];

            if (info_track->list_sector_.size() > 0)
            {
               // Allocate proper size
               unsigned short size = (dib[0x34 + i + (j * disk->nb_sides_)] << 8);

               unsigned char* track_data = new unsigned char[size];
               memset(track_data, 0, size);
               // Generate track data
               memcpy(track_data, "Track-Info\r\n", 12);
               track_data[0x10] = j;
               track_data[0x11] = i;

               // SZ = First N...
               track_data[0x14] = info_track->list_sector_[0].n;
               track_data[0x15] = static_cast<unsigned char>(info_track->list_sector_.size());
               track_data[0x16] = info_track->gap3_size_;
               track_data[0x17] = 0xE5; // ?

               // Sector information list
               offset = 0x18;
               int offset_data = 0x100;
               //for (std::vector<tSector>::iterator it = info_track->listSector.begin(); it != info_track->listSector.end(); it++)
               for (unsigned int sector_index = 0; sector_index < info_track->list_sector_.size(); sector_index++)
               {
                  ++nb_sectors;
                  track_data[offset++] = info_track->list_sector_[sector_index].c; // it->C;
                  track_data[offset++] = info_track->list_sector_[sector_index].h; // it->H;
                  track_data[offset++] = info_track->list_sector_[sector_index].r; // it->R;
                  track_data[offset++] = info_track->list_sector_[sector_index].n; // it->N;
                  track_data[offset++] = info_track->list_sector_[sector_index].status1; // it->Status1;
                  track_data[offset++] = info_track->list_sector_[sector_index].status2; // ->Status2;
                  track_data[offset++] = info_track->list_sector_[sector_index].real_size & 0xFF;
                  // (it->RealSize & 0xFF);
                  track_data[offset++] = info_track->list_sector_[sector_index].real_size >> 8; // (it->RealSize >> 8);

                  // Data
                  int index = info_track->list_sector_[sector_index].dam_offset + 64;
                  // it->DAMOffset + 64; // Jump the A1A1A1F8/B 4 bytes of IDAM.

                  for (int cpt = 0; cpt < info_track->list_sector_[sector_index].real_size/*  it->RealSize*/; cpt++)
                  {
                     track_data[offset_data++] = disk->GetNextByte(i, j, index);
                     if (offset_data > size)
                     {
                        int dbg = 1;
                     }
                     index += 16;
                  }
               }
               // Write it to the disk
               fwrite(track_data, size, 1, file);

               // Free tracks
               delete[]track_data;
            }
         }
      }

      // Free ressources
      fclose(file);
      delete[]track;

      disk->disk_modified_ = false;
   }
   return 0;
}